

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

void amrex::parser_print(amrex_parser *parser)

{
  AllPrint printer;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  Print *in_stack_fffffffffffffe20;
  allocator local_1c1;
  string local_1c0 [448];
  
  OutStream();
  AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffffe20,
                     (ostream *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  Print::SetPrecision(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"  ",&local_1c1);
  parser_ast_print((parser_node *)printer.super_Print._40_8_,(string *)printer.super_Print._32_8_,
                   (AllPrint *)printer.super_Print._24_8_);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  AllPrint::~AllPrint((AllPrint *)0x1628c13);
  return;
}

Assistant:

void
parser_print (struct amrex_parser* parser)
{
    amrex::AllPrint printer{};
    printer.SetPrecision(17);
    parser_ast_print(parser->ast, std::string("  "), printer);
}